

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.h
# Opt level: O0

uint64_t __thiscall
capnp::compiler::BrandedDecl::
getIdAndFillBrand<capnp::compiler::NodeTranslator::compileAnnotationApplications(capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>::Reader,kj::StringPtr)::__0>
          (BrandedDecl *this,Type *initBrand)

{
  bool bVar1;
  BrandScope *this_00;
  Type *initBrand_00;
  ResolvedDecl *pRVar2;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *initBrand_local;
  BrandedDecl *this_local;
  
  f.exception._6_1_ =
       kj::
       OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
       ::is<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
               ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal(&local_28);
  }
  this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(&this->brand);
  initBrand_00 = kj::
                 fwd<capnp::compiler::NodeTranslator::compileAnnotationApplications(capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>::Reader,kj::StringPtr)::__0>
                           (initBrand);
  BrandScope::
  compile<capnp::compiler::NodeTranslator::compileAnnotationApplications(capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>::Reader,kj::StringPtr)::__0>
            (this_00,initBrand_00);
  pRVar2 = kj::
           OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
           ::get<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
  return pRVar2->id;
}

Assistant:

uint64_t BrandedDecl::getIdAndFillBrand(InitBrandFunc&& initBrand) {
  KJ_REQUIRE(body.is<Resolver::ResolvedDecl>());

  brand->compile(kj::fwd<InitBrandFunc>(initBrand));
  return body.get<Resolver::ResolvedDecl>().id;
}